

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O3

linear_header * create_linear_node(void *ralloc_ctx,uint min_size)

{
  linear_header *plVar1;
  ulong uVar2;
  
  uVar2 = 0x800;
  if (0x800 < min_size + 8) {
    uVar2 = (ulong)(min_size + 8);
  }
  plVar1 = (linear_header *)ralloc_size(ralloc_ctx,uVar2 + 0x30);
  if (plVar1 != (linear_header *)0x0) {
    plVar1->magic = 0x87b9c7d3;
    plVar1->offset = 0;
    plVar1->size = (uint)uVar2;
    plVar1->ralloc_parent = ralloc_ctx;
    plVar1->next = (linear_header *)0x0;
    plVar1->latest = plVar1;
  }
  return plVar1;
}

Assistant:

static linear_header *
create_linear_node(void *ralloc_ctx, unsigned min_size)
{
   linear_header *node;

   min_size += sizeof(linear_size_chunk);

   if (likely(min_size < MIN_LINEAR_BUFSIZE))
      min_size = MIN_LINEAR_BUFSIZE;

   node = ralloc_size(ralloc_ctx, sizeof(linear_header) + min_size);
   if (unlikely(!node))
      return NULL;

#ifndef NDEBUG
   node->magic = LMAGIC;
#endif
   node->offset = 0;
   node->size = min_size;
   node->ralloc_parent = ralloc_ctx;
   node->next = NULL;
   node->latest = node;
   return node;
}